

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::updateBranch(Solver *this,uint32 n)

{
  uint32 uVar1;
  size_type sVar2;
  reference puVar3;
  int in_ESI;
  uint *in_RDI;
  size_type unaff_retaddr;
  iterator in_stack_00000008;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  int32 xl;
  int32 dl;
  uint32 local_14;
  int local_c;
  uint *val;
  
  val = in_RDI;
  uVar1 = decisionLevel((Solver *)0x1f069c);
  sVar2 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x74));
  local_14 = sVar2 - 1;
  local_c = in_ESI;
  if ((int)uVar1 < (int)local_14) {
    do {
      puVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x74)
                         );
      local_c = *puVar3 + local_c;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x74));
      local_14 = local_14 - 1;
    } while (local_14 != uVar1);
  }
  else if ((int)local_14 < (int)uVar1) {
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x74));
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,val);
  }
  puVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x74));
  *puVar3 = local_c + *puVar3;
  return;
}

Assistant:

void Solver::updateBranch(uint32 n) {
	int32 dl = (int32)decisionLevel(), xl = static_cast<int32>(cflStamp_.size())-1;
	if      (xl > dl) { do { n += cflStamp_.back(); cflStamp_.pop_back(); } while (--xl != dl); }
	else if (dl > xl) { cflStamp_.insert(cflStamp_.end(), dl - xl, 0); }
	cflStamp_.back() += n;
}